

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O3

int __thiscall Samba::connect(Samba *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  SerialPort *pSVar1;
  int iVar2;
  undefined8 unaff_RBP;
  undefined7 uVar3;
  undefined4 in_register_00000034;
  EVP_PKEY_CTX *pEVar4;
  SerialPort *pSVar5;
  
  pSVar5 = *(SerialPort **)CONCAT44(in_register_00000034,__fd);
  *(undefined8 *)CONCAT44(in_register_00000034,__fd) = 0;
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
  super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
  super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl = pSVar5;
  if (pSVar1 != (SerialPort *)0x0) {
    (*pSVar1->_vptr_SerialPort[1])(pSVar1);
    pSVar5 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  }
  iVar2 = (*pSVar5->_vptr_SerialPort[4])();
  this->_isUsb = SUB41(iVar2,0);
  uVar3 = (undefined7)((ulong)unaff_RBP >> 8);
  if (SUB41(iVar2,0) != false) {
    pSVar5 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    pEVar4 = (EVP_PKEY_CTX *)0xe1000;
    iVar2 = (*pSVar5->_vptr_SerialPort[2])(pSVar5,0xe1000,8,0,0);
    if (((char)iVar2 != '\0') && (iVar2 = init(this,pEVar4), (char)iVar2 != '\0')) {
      iVar2 = (int)CONCAT71(uVar3,1);
      if (this->_debug != true) {
        return iVar2;
      }
      puts("Connected at 921600 baud");
      return iVar2;
    }
    (*((this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
       super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
       super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[3])();
  }
  this->_isUsb = false;
  pSVar5 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  pEVar4 = (EVP_PKEY_CTX *)((ulong)__addr & 0xffffffff);
  iVar2 = (*pSVar5->_vptr_SerialPort[2])(pSVar5,pEVar4,8,0,0);
  if (((char)iVar2 != '\0') && (iVar2 = init(this,pEVar4), (char)iVar2 != '\0')) {
    iVar2 = (int)CONCAT71(uVar3,1);
    if (this->_debug != true) {
      return iVar2;
    }
    printf("Connected at %d baud\n",(ulong)__addr & 0xffffffff);
    return iVar2;
  }
  (*((this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
     super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
     super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[3])();
  (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
  super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
  super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl = (SerialPort *)0x0;
  return 0;
}

Assistant:

bool
Samba::connect(SerialPort::Ptr port, int bps)
{
    _port = move(port);

    // Try to connect at a high speed if USB
    _isUsb = _port->isUsb();
    if (_isUsb)
    {
        if (_port->open(921600) && init())
        {
            if (_debug)
                printf("Connected at 921600 baud\n");
            return true;
        }
        else
        {
            _port->close();
        }
    }
    _isUsb = false;

    // Try the serial port at slower speed
    if (_port->open(bps) && init())
    {
        if (_debug)
            printf("Connected at %d baud\n", bps);
        return true;
    }

    disconnect();
    return false;
}